

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *enumNode)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  ulong size;
  bool *pbVar4;
  size_t __n;
  ArrayPtr<bool> AVar5;
  Iterator IVar6;
  ArrayPtr<const_char> name;
  byte local_209;
  ArrayPtr<const_char> local_190;
  Fault local_180;
  Fault f;
  DebugComparison<unsigned_short,_unsigned_int> local_170;
  bool local_149;
  undefined1 auStack_148 [7];
  bool _kjCondition;
  size_t sStack_140;
  ArrayPtr<const_char> local_138;
  undefined1 local_128 [8];
  Reader enumerant;
  undefined1 local_e8 [8];
  Iterator __end2;
  undefined1 local_c8 [8];
  Iterator __begin2;
  Reader *__range2;
  uint index;
  undefined1 local_a0 [8];
  ArrayPtr<bool> sawCodeOrder;
  Array<bool> sawCodeOrder_heap;
  bool sawCodeOrder_stack [32];
  bool sawCodeOrder_isOnStack;
  size_t sawCodeOrder_size;
  Reader enumerants;
  Reader *enumNode_local;
  Validator *this_local;
  
  enumerants.reader._40_8_ = enumNode;
  capnp::schema::Node::Enum::Reader::getEnumerants((Reader *)&sawCodeOrder_size,enumNode);
  uVar3 = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size)
  ;
  size = (ulong)uVar3;
  if (size < 0x21) {
    kj::Array<bool>::Array((Array<bool> *)&sawCodeOrder.size_,(void *)0x0);
    AVar5 = kj::arrayPtr<bool>((bool *)&sawCodeOrder_heap.disposer,size);
  }
  else {
    kj::heapArray<bool>((Array<bool> *)&sawCodeOrder.size_,size);
    AVar5 = kj::Array::operator_cast_to_ArrayPtr((Array *)&sawCodeOrder.size_);
  }
  sawCodeOrder.ptr = (bool *)AVar5.size_;
  local_a0 = (undefined1  [8])AVar5.ptr;
  pbVar4 = kj::ArrayPtr<bool>::begin((ArrayPtr<bool> *)local_a0);
  __n = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)local_a0);
  memset(pbVar4,0,__n);
  __range2._0_4_ = 0;
  __begin2._8_8_ = &sawCodeOrder_size;
  IVar6 = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::begin((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar6.container;
  __begin2.container._0_4_ = IVar6.index;
  local_c8 = (undefined1  [8])__end2._8_8_;
  IVar6 = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  enumerant._reader._40_8_ = IVar6.container;
  __end2.container._0_4_ = IVar6.index;
  local_e8 = (undefined1  [8])enumerant._reader._40_8_;
  do {
    bVar1 = _::
            IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                          *)local_c8,
                         (IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                          *)local_e8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_002a77ab:
      kj::Array<bool>::~Array((Array<bool> *)&sawCodeOrder.size_);
      return;
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
    ::operator*((Reader *)local_128,
                (IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                 *)local_c8);
    name = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName((Reader *)local_128);
    _auStack_148 = name;
    local_138 = name;
    validateMemberName(this,(StringPtr)name,(uint)__range2);
    f.exception._4_2_ = capnp::schema::Enumerant::Reader::getCodeOrder((Reader *)local_128);
    f.exception._6_2_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (unsigned_short *)((long)&f.exception + 4));
    f.exception._0_4_ =
         List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
    kj::_::DebugExpression<unsigned_short>::operator<
              (&local_170,(DebugExpression<unsigned_short> *)((long)&f.exception + 6),(uint *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_170);
    local_209 = 0;
    if (bVar1) {
      uVar2 = capnp::schema::Enumerant::Reader::getCodeOrder((Reader *)local_128);
      pbVar4 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_a0,(ulong)uVar2);
      local_209 = *pbVar4 ^ 0xff;
    }
    local_149 = (bool)(local_209 & 1);
    if (local_149 == false) {
      local_190 = (ArrayPtr<const_char>)
                  capnp::schema::Enumerant::Reader::getName((Reader *)local_128);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18],capnp::Text::Reader>
                (&local_180,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x1a5,FAILED,
                 "enumerant.getCodeOrder() < enumerants.size() && !sawCodeOrder[enumerant.getCodeOrder()]"
                 ,"_kjCondition,\"invalid codeOrder\", enumerant.getName()",&local_149,
                 (char (*) [18])"invalid codeOrder",(Reader *)&local_190);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&local_180);
      goto LAB_002a77ab;
    }
    uVar2 = capnp::schema::Enumerant::Reader::getCodeOrder((Reader *)local_128);
    pbVar4 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_a0,(ulong)uVar2);
    *pbVar4 = true;
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                  *)local_c8);
    __range2._0_4_ = (uint)__range2 + 1;
  } while( true );
}

Assistant:

KJ_STACK_ARRAY(bool, sawCodeOrder, enumerants.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto enumerant: enumerants) {
      validateMemberName(enumerant.getName(), index++);

      VALIDATE_SCHEMA(enumerant.getCodeOrder() < enumerants.size() &&
                      !sawCodeOrder[enumerant.getCodeOrder()],
                      "invalid codeOrder", enumerant.getName());
      sawCodeOrder[enumerant.getCodeOrder()] = true;
    }